

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

uchar * mcmalo1(mcmcx1def *ctx,ushort siz,mcmon *nump)

{
  mcmon *lst;
  ushort uVar1;
  mcmon *pmVar2;
  mcmodef *pmVar3;
  ushort uVar4;
  mcmon *extraout_RDX;
  ulong uVar5;
  mcmodef *pmVar6;
  ushort siz_00;
  ushort uVar7;
  ushort n_00;
  mcmon n;
  ushort local_3a;
  mcmon *local_38;
  
  siz_00 = siz + 7 & 0xfff8;
  local_38 = nump;
  if (0x8000 < siz_00) {
    errsigf(ctx->mcmcxerr,"TADS",0x12);
  }
  lst = &ctx->mcmcxfre;
  do {
    uVar4 = *lst;
    if (uVar4 == 0xffff) {
      pmVar3 = (mcmodef *)0x0;
      n_00 = 0xffff;
    }
    else {
      pmVar6 = (mcmodef *)0x0;
      uVar7 = 0xffff;
      do {
        pmVar3 = ctx->mcmcxtab[uVar4 >> 8] + (byte)uVar4;
        uVar1 = ctx->mcmcxtab[uVar4 >> 8][(byte)uVar4].mcmosiz;
        n_00 = uVar4;
        if (uVar1 == siz_00) break;
        n_00 = uVar7;
        if ((siz_00 < uVar1) && ((uVar7 == 0xffff || (uVar1 < (ushort)nump)))) {
          nump = (mcmon *)(ulong)uVar1;
          pmVar6 = pmVar3;
          n_00 = uVar4;
        }
        uVar4 = pmVar3->mcmonxt;
        pmVar3 = pmVar6;
        uVar7 = n_00;
      } while (uVar4 != 0xffff);
    }
    if (n_00 != 0xffff) {
      mcmunl(ctx,n_00,lst);
      *(byte *)&pmVar3->mcmoflg = (byte)pmVar3->mcmoflg & 0x7f;
      (pmVar3->mcmoloc).mcmolocs = 0xffff;
      local_3a = n_00;
      mcmsplt(ctx,n_00,siz_00);
      uVar5 = (ulong)((n_00 & 0xff) << 5);
      *(undefined2 *)((long)&ctx->mcmcxtab[n_00 >> 8]->mcmoflg + uVar5) = 0xe;
      (&ctx->mcmcxtab[n_00 >> 8]->mcmolcnt)[uVar5] = '\x01';
      *local_38 = n_00;
      return pmVar3->mcmoptr;
    }
    local_3a = n_00;
    pmVar2 = (mcmon *)mcmhalo(ctx);
    if (pmVar2 == (mcmon *)0x0) goto LAB_002195da;
    pmVar3 = mcmoal(ctx,&local_3a);
    if (local_3a == 0xffff) {
      ctx->mcmcxhpch = *(mcmhdef **)(pmVar2 + -4);
      free(pmVar2 + -4);
LAB_002195da:
      *local_38 = 0xffff;
      return (uchar *)0x0;
    }
    *pmVar2 = local_3a;
    pmVar3->mcmoptr = (uchar *)(pmVar2 + 4);
    pmVar3->mcmosiz = 0x7ff8;
    pmVar3->mcmoflg = 0x80;
    mcmlnkhd(ctx,lst,local_3a);
    nump = extraout_RDX;
  } while( true );
}

Assistant:

static uchar *mcmalo1(mcmcx1def *ctx, ushort siz, mcmon *nump)
{
    mcmon    n;
    mcmodef *o;
    uchar   *chunk;
    
    MCMGLBCTX(ctx);

    /* round size to appropriate multiple */
    siz = osrndsz(siz);

    /* if it's bigger than the chunk size, we can't allocate it */
    if (siz > MCMCHUNK)
        errsig(ctx->mcmcxerr, ERR_BIGOBJ);

startover:
    /* look in the free block chain for a fit to the request */
    o = mcmffb(ctx, siz, &n);
    if (n != MCMONINV)
    {
        mcmsplt(ctx, n, siz);               /* split the block if necessary */
        mcmgobje(ctx, n)->mcmoflg = MCMOFNODISC | MCMOFLOCK | MCMOFPRES;
        mcmgobje(ctx, n)->mcmolcnt = 1;                /* one locker so far */
        *nump = n;
        return(o->mcmoptr);
    }
    
    /* nothing found; we must get space out of the heap if possible */
    chunk = mcmhalo(ctx);                            /* get space from heap */
    if (!chunk) goto error;           /* can't get any more space from heap */
    o = mcmoal(ctx, &n);               /* set up cache entry for free space */
    if (n == MCMONINV)
    {
        mcmhdef *chunk_hdr = ((mcmhdef *)chunk) - 1;
        ctx->mcmcxhpch = chunk_hdr->mcmhnxt;
        mchfre(chunk_hdr);
        goto error;         /* any error means we can't allocate the memory */
    }
    
    *(mcmon *)chunk = n;                               /* set object header */
    chunk += osrndsz(sizeof(mcmon));
    o->mcmoptr = chunk;
    o->mcmosiz = MCMCHUNK - osrndsz(sizeof(mcmon));
    o->mcmoflg = MCMOFFREE;
    mcmlnkhd(ctx, &ctx->mcmcxfre, n);
    goto startover;              /* try again, now that we have some memory */
    
error:
    *nump = MCMONINV;
    return((uchar *)0);
}